

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRefUtil.cpp
# Opt level: O0

Move<vk::VkCommandBuffer_s_*> *
vk::allocateCommandBuffer
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,DeviceInterface *vk,VkDevice device
          ,VkCommandPool commandPool,VkCommandBufferLevel level)

{
  undefined1 local_50 [8];
  VkCommandBufferAllocateInfo allocInfo;
  VkCommandBufferLevel level_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkCommandPool commandPool_local;
  
  local_50._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.commandPool.m_internal._4_4_ = 1;
  allocInfo.pNext = (void *)commandPool.m_internal;
  allocInfo.commandPool.m_internal._0_4_ = level;
  allocInfo.commandBufferCount = level;
  allocateCommandBuffer(__return_storage_ptr__,vk,device,(VkCommandBufferAllocateInfo *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandBuffer> allocateCommandBuffer (const DeviceInterface&	vk,
											 VkDevice				device,
											 VkCommandPool			commandPool,
											 VkCommandBufferLevel	level)
{
	const VkCommandBufferAllocateInfo allocInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
		DE_NULL,

		commandPool,
		level,
		1
	};

	return allocateCommandBuffer(vk, device, &allocInfo);
}